

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

DividerClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DividerClauseSyntax,slang::syntax::DividerClauseSyntax_const&>
          (BumpAllocator *this,DividerClauseSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  undefined4 uVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  DividerClauseSyntax *pDVar13;
  
  pDVar13 = (DividerClauseSyntax *)allocate(this,0x38,8);
  uVar4 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  pSVar2 = (args->super_SyntaxNode).previewNode;
  TVar5 = (args->divide).kind;
  uVar6 = (args->divide).field_0x2;
  NVar7.raw = (args->divide).numFlags.raw;
  uVar8 = (args->divide).rawLen;
  pIVar3 = (args->divide).info;
  TVar9 = (args->value).kind;
  uVar10 = (args->value).field_0x2;
  NVar11.raw = (args->value).numFlags.raw;
  uVar12 = (args->value).rawLen;
  (pDVar13->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
  *(undefined4 *)&(pDVar13->super_SyntaxNode).field_0x4 = uVar4;
  (pDVar13->super_SyntaxNode).parent = pSVar1;
  (pDVar13->super_SyntaxNode).previewNode = pSVar2;
  (pDVar13->divide).kind = TVar5;
  (pDVar13->divide).field_0x2 = uVar6;
  (pDVar13->divide).numFlags = (NumericTokenFlags)NVar7.raw;
  (pDVar13->divide).rawLen = uVar8;
  (pDVar13->divide).info = pIVar3;
  (pDVar13->value).kind = TVar9;
  (pDVar13->value).field_0x2 = uVar10;
  (pDVar13->value).numFlags = (NumericTokenFlags)NVar11.raw;
  (pDVar13->value).rawLen = uVar12;
  (pDVar13->value).info = (args->value).info;
  return pDVar13;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }